

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef fori_arg(jit_State *J,BCIns *fori,BCReg slot,IRType t,int mode)

{
  BCReg BVar1;
  TRef TVar2;
  
  TVar2 = J->base[slot];
  if (TVar2 == 0) {
    TVar2 = find_kinit(J,fori,slot,t);
    if (TVar2 == 0) {
      BVar1 = J->baseslot;
      (J->fold).ins.field_0.ot = (ushort)(t == IRT_INT) * 0x80 + (short)t | 0x4700;
      (J->fold).ins.field_0.op1 = (short)BVar1 + (short)slot;
      (J->fold).ins.field_0.op2 = (ushort)(t == IRT_INT) * 8 + 0x30;
      TVar2 = lj_ir_emit(J);
      J->base[(int)slot] = TVar2;
    }
  }
  return TVar2;
}

Assistant:

static TRef fori_arg(jit_State *J, const BCIns *fori, BCReg slot,
		     IRType t, int mode)
{
  TRef tr = J->base[slot];
  if (!tr) {
    tr = find_kinit(J, fori, slot, t);
    if (!tr)
      tr = fori_load(J, slot, t, mode);
  }
  return tr;
}